

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O1

TValue * lj_tab_set(lua_State *L,GCtab *t,cTValue *key)

{
  double dVar1;
  ulong uVar2;
  double dVar3;
  int iVar4;
  TValue *pTVar5;
  MRef MVar6;
  uint key_00;
  TValue *unaff_R12;
  
  t->nomm = '\0';
  uVar2 = key->it64;
  if ((long)uVar2 >> 0x2f == 0xfffffffffffffffb) {
    pTVar5 = lj_tab_setstr(L,t,(GCstr *)(uVar2 & 0x7fffffffffff));
    return pTVar5;
  }
  if ((ulong)((long)uVar2 >> 0x2f) < 0xfffffffffffffff2) {
    dVar1 = key->n;
    dVar3 = (double)(int)dVar1;
    if ((dVar1 != dVar3) || (NAN(dVar1) || NAN(dVar3))) {
      if (NAN(dVar1)) {
        lj_err_msg(L,LJ_ERR_NANIDX);
      }
    }
    else {
      key_00 = (uint)dVar1;
      if (key_00 < t->asize) {
        unaff_R12 = (TValue *)((long)(int)key_00 * 8 + (t->array).ptr64);
      }
      else {
        unaff_R12 = lj_tab_setinth(L,t,key_00);
      }
    }
    if ((dVar1 == dVar3) && (!NAN(dVar1) && !NAN(dVar3))) {
      return unaff_R12;
    }
  }
  else if (uVar2 == 0xffffffffffffffff) {
    lj_err_msg(L,LJ_ERR_NILIDX);
  }
  MVar6.ptr64 = (uint64_t)hashkey(t,key);
  do {
    iVar4 = lj_obj_equal((cTValue *)(MVar6.ptr64 + 8),key);
    if (iVar4 != 0) {
      return (TValue *)MVar6.ptr64;
    }
    MVar6.ptr64 = ((TValue *)(MVar6.ptr64 + 0x10))->u64;
  } while (MVar6.ptr64 != 0);
  pTVar5 = lj_tab_newkey(L,t,key);
  return pTVar5;
}

Assistant:

TValue *lj_tab_set(lua_State *L, GCtab *t, cTValue *key)
{
  Node *n;
  t->nomm = 0;  /* Invalidate negative metamethod cache. */
  if (tvisstr(key)) {
    return lj_tab_setstr(L, t, strV(key));
  } else if (tvisint(key)) {
    return lj_tab_setint(L, t, intV(key));
  } else if (tvisnum(key)) {
    lua_Number nk = numV(key);
    int32_t k = lj_num2int(nk);
    if (nk == (lua_Number)k)
      return lj_tab_setint(L, t, k);
    if (tvisnan(key))
      lj_err_msg(L, LJ_ERR_NANIDX);
    /* Else use the generic lookup. */
  } else if (tvisnil(key)) {
    lj_err_msg(L, LJ_ERR_NILIDX);
  }
  n = hashkey(t, key);
  do {
    if (lj_obj_equal(&n->key, key))
      return &n->val;
  } while ((n = nextnode(n)));
  return lj_tab_newkey(L, t, key);
}